

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall QWidgetTextControlPrivate::commitPreedit(QWidgetTextControlPrivate *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QWidgetTextControlPrivate *in_RDI;
  long in_FS_OFFSET;
  QTextLayout *layout;
  QTextBlock block;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = isPreediting(in_RDI);
  if (bVar2) {
    QGuiApplication::inputMethod();
    QInputMethod::commit();
    bVar2 = isPreediting(in_RDI);
    if (bVar2) {
      QTextCursor::beginEditBlock();
      in_RDI->preeditCursor = 0;
      QTextCursor::block();
      iVar3 = QTextBlock::layout();
      QString::QString((QString *)0x71a25f);
      QTextLayout::setPreeditArea(iVar3,(QString *)0xffffffff);
      QString::~QString((QString *)0x71a27d);
      QTextLayout::clearFormats();
      QTextCursor::endEditBlock();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetTextControlPrivate::commitPreedit()
{
    if (!isPreediting())
        return;

    QGuiApplication::inputMethod()->commit();

    if (!isPreediting())
        return;

    cursor.beginEditBlock();
    preeditCursor = 0;
    QTextBlock block = cursor.block();
    QTextLayout *layout = block.layout();
    layout->setPreeditArea(-1, QString());
    layout->clearFormats();
    cursor.endEditBlock();
}